

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int bc_get_u64(BCReaderState *s,uint64_t *pval)

{
  uint64_t uVar1;
  uint64_t *in_RSI;
  BCReaderState *in_RDI;
  int local_4;
  
  if ((long)in_RDI->buf_end - (long)in_RDI->ptr < 8) {
    *in_RSI = 0;
    local_4 = bc_read_error_end(in_RDI);
  }
  else {
    uVar1 = get_u64(in_RDI->ptr);
    *in_RSI = uVar1;
    in_RDI->ptr = in_RDI->ptr + 8;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int bc_get_u64(BCReaderState *s, uint64_t *pval)
{
    if (unlikely(s->buf_end - s->ptr < 8)) {
        *pval = 0; /* avoid warning */
        return bc_read_error_end(s);
    }
    *pval = get_u64(s->ptr);
    s->ptr += 8;
    return 0;
}